

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gwham.hpp
# Opt level: O1

gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double> * __thiscall
WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
::calrho(gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>
         *__return_storage_ptr__,
        WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
        *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *_dim,pEnsemble *_V)

{
  _Rb_tree_header *p_Var1;
  pointer *__return_storage_ptr___00;
  element_type *peVar2;
  bool bVar3;
  char cVar4;
  type pFVar5;
  pointer puVar6;
  const_iterator cVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  ostream *poVar11;
  long lVar12;
  ulong uVar13;
  uint *__args;
  ulong uVar14;
  uint uVar15;
  double extraout_XMM0_Qa;
  undefined1 local_c0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> histids;
  vector<double,_std::allocator<double>_> vals;
  coordtype coord;
  void *pvStack_58;
  coordtype rhocoord;
  
  if ((ulong)this->dim <
      (ulong)((long)(_dim->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(_dim->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2)) {
    poVar11 = std::operator<<((ostream *)&std::cerr,"The number of dimension can\'t be larger than "
                             );
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->dim);
LAB_0013b0a9:
    std::endl<char,std::char_traits<char>>(poVar11);
    exit(-1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"#Calculating probability density along dimension: ",0x32);
  pFVar5 = FormatStream<std::ostream>::operator<<((FormatStream<std::ostream> *)&fcout,_dim);
  cVar4 = (char)pFVar5->stream;
  std::ios::widen((char)*(undefined8 *)(*(long *)pFVar5->stream + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  puVar6 = (_dim->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar12 = (long)(_dim->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar6;
  if (lVar12 != 0) {
    uVar15 = 1;
    uVar13 = 0;
    do {
      if (this->dim <= puVar6[uVar13]) {
        poVar11 = std::operator<<((ostream *)&std::cerr,
                                  "The dimension of probability density must be in the range of [0, "
                                 );
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,this->dim - 1);
        poVar11 = std::operator<<(poVar11,"]");
        goto LAB_0013b0a9;
      }
      uVar13 = (ulong)uVar15;
      uVar15 = uVar15 + 1;
    } while (uVar13 < (ulong)(lVar12 >> 2));
  }
  gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>::gnarray
            (__return_storage_ptr__,&(this->DOS).DOS,_dim);
  p_Var10 = (this->record)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->record)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var1) {
    do {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(p_Var10 + 1));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_c0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var10[1]._M_right);
      __return_storage_ptr___00 =
           &histids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      coord2val((vector<double,_std::allocator<double>_> *)__return_storage_ptr___00,this,
                (coordtype *)
                &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      peVar2 = (_V->super___shared_ptr<Ensemble,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (**peVar2->_vptr_Ensemble)(peVar2,__return_storage_ptr___00);
      rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)exp(-extraout_XMM0_Qa);
      pvStack_58 = (void *)0x0;
      rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      puVar6 = (_dim->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((_dim->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish != puVar6) {
        uVar13 = 0;
        uVar14 = 1;
        do {
          __args = (uint *)((ulong)puVar6[uVar13] * 4 +
                           (long)vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
          if (rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start ==
              rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pvStack_58,
                       (iterator)
                       rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,__args);
          }
          else {
            *rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start = *__args;
            rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
          puVar6 = (_dim->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          bVar3 = uVar14 < (ulong)((long)(_dim->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)puVar6
                                  >> 2);
          uVar13 = uVar14;
          uVar14 = (ulong)((int)uVar14 + 1);
        } while (bVar3);
      }
      cVar7 = std::
              _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
              ::find((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
                      *)&this->DOS,
                     (key_type *)
                     &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((double)rhocoord.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage *
                    (double)cVar7._M_node[1]._M_right);
      iVar8 = std::
              _Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
              ::find((_Rb_tree<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>,_std::_Select1st<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
                      *)__return_storage_ptr__,(key_type *)&pvStack_58);
      if ((_Rb_tree_header *)iVar8._M_node ==
          &(__return_storage_ptr__->narr)._M_t._M_impl.super__Rb_tree_header) {
        pmVar9 = std::
                 map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
                 ::operator[](&__return_storage_ptr__->narr,(key_type *)&pvStack_58);
        puVar6 = rhocoord.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      else {
        pmVar9 = std::
                 map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
                 ::operator[](&__return_storage_ptr__->narr,(key_type *)&pvStack_58);
        puVar6 = (pointer)((double)rhocoord.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + *pmVar9);
      }
      *pmVar9 = (mapped_type)puVar6;
      if (pvStack_58 != (void *)0x0) {
        operator_delete(pvStack_58);
      }
      if (histids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(histids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (local_c0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_c0);
      }
      if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        operator_delete(vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var1);
  }
  return __return_storage_ptr__;
}

Assistant:

NARRAY WHAM<PENSEMBLE,HISTOGRAM,NARRAY>::calrho(const vector<uint>& _dim, const pEnsemble& _V) const {

  if(_dim.size() > dim) {
    cerr << "The number of dimension can't be larger than " << dim << endl;
    exit(-1);
  }

  cout << "#Calculating probability density along dimension: ";
  fcout << _dim << endl;

  //Construct the total bin-size in all the dimension 
  /*valtype binsize_sub = 1;
  for(uint i = 0; i < binsize.size(); ++i) {
    binsize_sub *= binsize[i];
    cout << "# " << i << " binsize_sub = " << binsize_sub << endl;
  }*/
  //Check if the _dim actually make sense, i.e., if they are in the range of [0, DOS.dim-1]
  //project out all the dimension irrelevent to the PMF BTW
  for(uint i = 0; i < _dim.size(); ++i) {
    if(_dim[i] >= dim) {
      cerr << "The dimension of probability density must be in the range of [0, " << dim-1  << "]" << endl;;
      exit(-1);
    }
    //const uint dimindex = _dim[i];
    //binsize_sub /= binsize[dimindex];
  }

  NARRAY rho(DOS.getdosarr(),_dim);
  //Again we only loop through non-zero elements of DOS
  for(map<coordtype, vector<uint> >::const_iterator it = record.begin(); it != record.end(); ++it) {
    const coordtype coord = it->first;
    const vector<uint> histids = it->second;
    const vector<valtype> vals = coord2val(coord);
    const valtype exparg = -_V->ener(vals);
    //if(exparg > MAXEXPARG ) { cerr << "In WHAM::calrho: exp("<<exparg<<") will overflow!\n"; exit(-1); }
    //else if(exparg < MINEXPARG) { continue; }
    const valtype weight = exp(exparg);

    //construct a vector<uint> as the coordinate of the PMF
    coordtype rhocoord;
    for(uint i = 0; i < _dim.size(); ++i) {
      rhocoord.push_back(coord[_dim[i]]);
    }
    
    //Update the PMF
    //cout << "#DOS[coord] = " << DOS[coord] << " exparg = " << exparg << " weight = " << weight << " binsize_sub = " << binsize_sub << endl;
    const valtype rhov = DOS[coord]*weight; //There should be a binsize factor here but if we only care about relative probability (density), it cancels out in the ratio
                                            //The reason why I didn't multiply with the binsize factor is that it could get very large in multidimensional cases
    const typename NARRAY::iterator rhoit = rho.find(rhocoord);
    if( rhoit != rho.end()) {
      rho[rhocoord] += rhov;
    }
    else {
      rho[rhocoord] = rhov; 
    }
  }
  return rho;
}